

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cardinality_estimator.cpp
# Opt level: O2

void __thiscall
duckdb::CardinalityEstimator::InitEquivalentRelations
          (CardinalityEstimator *this,
          vector<duckdb::unique_ptr<duckdb::FilterInfo,_std::default_delete<duckdb::FilterInfo>,_true>,_true>
          *filter_infos)

{
  CardinalityEstimator *pCVar1;
  optional_ptr<duckdb::FilterInfo,_true> filter_info;
  bool bVar2;
  type pFVar3;
  CardinalityEstimator *this_00;
  CardinalityEstimator *this_01;
  vector<unsigned_long,_true> matching_equivalent_sets;
  _Vector_base<unsigned_long,_std::allocator<unsigned_long>_> local_60;
  vector<unsigned_long,_std::allocator<unsigned_long>_> local_48 [24];
  
  pCVar1 = (CardinalityEstimator *)
           (filter_infos->
           super_vector<duckdb::unique_ptr<duckdb::FilterInfo,_std::default_delete<duckdb::FilterInfo>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::FilterInfo,_std::default_delete<duckdb::FilterInfo>,_true>_>_>
           ).
           super__Vector_base<duckdb::unique_ptr<duckdb::FilterInfo,_std::default_delete<duckdb::FilterInfo>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::FilterInfo,_std::default_delete<duckdb::FilterInfo>,_true>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  for (this_01 = (CardinalityEstimator *)
                 (filter_infos->
                 super_vector<duckdb::unique_ptr<duckdb::FilterInfo,_std::default_delete<duckdb::FilterInfo>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::FilterInfo,_std::default_delete<duckdb::FilterInfo>,_true>_>_>
                 ).
                 super__Vector_base<duckdb::unique_ptr<duckdb::FilterInfo,_std::default_delete<duckdb::FilterInfo>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::FilterInfo,_std::default_delete<duckdb::FilterInfo>,_true>_>_>
                 ._M_impl.super__Vector_impl_data._M_start; this_01 != pCVar1;
      this_01 = (CardinalityEstimator *)
                &(this_01->relations_to_tdoms).
                 super_vector<duckdb::RelationsToTDom,_std::allocator<duckdb::RelationsToTDom>_>.
                 super__Vector_base<duckdb::RelationsToTDom,_std::allocator<duckdb::RelationsToTDom>_>
                 ._M_impl.super__Vector_impl_data._M_finish) {
    this_00 = this_01;
    pFVar3 = unique_ptr<duckdb::FilterInfo,_std::default_delete<duckdb::FilterInfo>,_true>::
             operator*((unique_ptr<duckdb::FilterInfo,_std::default_delete<duckdb::FilterInfo>,_true>
                        *)this_01);
    bVar2 = SingleColumnFilter(this_00,pFVar3);
    pFVar3 = unique_ptr<duckdb::FilterInfo,_std::default_delete<duckdb::FilterInfo>,_true>::
             operator*((unique_ptr<duckdb::FilterInfo,_std::default_delete<duckdb::FilterInfo>,_true>
                        *)this_01);
    if (bVar2) {
      AddRelationTdom(this,pFVar3);
    }
    else if ((pFVar3->right_set).ptr != (JoinRelationSet *)0x0 ||
             (pFVar3->left_set).ptr != (JoinRelationSet *)0x0) {
      DetermineMatchingEquivalentSets
                ((vector<unsigned_long,_true> *)&local_60,this,
                 (FilterInfo *)
                 (this_01->relations_to_tdoms).
                 super_vector<duckdb::RelationsToTDom,_std::allocator<duckdb::RelationsToTDom>_>.
                 super__Vector_base<duckdb::RelationsToTDom,_std::allocator<duckdb::RelationsToTDom>_>
                 ._M_impl.super__Vector_impl_data._M_start);
      filter_info.ptr =
           (FilterInfo *)
           (this_01->relations_to_tdoms).
           super_vector<duckdb::RelationsToTDom,_std::allocator<duckdb::RelationsToTDom>_>.
           super__Vector_base<duckdb::RelationsToTDom,_std::allocator<duckdb::RelationsToTDom>_>.
           _M_impl.super__Vector_impl_data._M_start;
      ::std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
                (local_48,(vector<unsigned_long,_std::allocator<unsigned_long>_> *)&local_60);
      AddToEquivalenceSets(this,filter_info,(vector<unsigned_long,_true> *)local_48);
      ::std::_Vector_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Vector_base
                ((_Vector_base<unsigned_long,_std::allocator<unsigned_long>_> *)local_48);
      ::std::_Vector_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Vector_base(&local_60);
    }
  }
  RemoveEmptyTotalDomains(this);
  return;
}

Assistant:

void CardinalityEstimator::InitEquivalentRelations(const vector<unique_ptr<FilterInfo>> &filter_infos) {
	// For each filter, we fill keep track of the index of the equivalent relation set
	// the left and right relation needs to be added to.
	for (auto &filter : filter_infos) {
		if (SingleColumnFilter(*filter)) {
			// Filter on one relation, (i.e. string or range filter on a column).
			// Grab the first relation and add it to  the equivalence_relations
			AddRelationTdom(*filter);
			continue;
		} else if (EmptyFilter(*filter)) {
			continue;
		}
		D_ASSERT(filter->left_set->count >= 1);
		D_ASSERT(filter->right_set->count >= 1);

		auto matching_equivalent_sets = DetermineMatchingEquivalentSets(filter.get());
		AddToEquivalenceSets(filter.get(), matching_equivalent_sets);
	}
	RemoveEmptyTotalDomains();
}